

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseGlobalType(WastParser *this,Global *global)

{
  bool bVar1;
  Result RVar2;
  Type TVar3;
  Type TVar4;
  Var *pVVar5;
  long lVar6;
  long *plVar7;
  Var type_1;
  Var type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  undefined1 local_e8 [32];
  undefined1 *local_c8;
  undefined1 local_c0 [40];
  undefined1 local_98 [16];
  long *local_88 [2];
  long local_78 [2];
  Var local_68;
  
  bVar1 = MatchLpar(this,Mut);
  if (bVar1) {
    global->mutable_ = true;
    Var::Var(&local_68);
    RVar2 = ParseValueType(this,&local_68);
    if (RVar2.enum_ != Error) {
      if (local_68.type_ != Index) goto LAB_00140aa4;
      TVar3.type_index_ = 0;
      TVar3.enum_ = local_68.field_2.index_;
      if (TVar3 == (Type)0xffffffeb) goto LAB_00140ac3;
      global->type = TVar3;
      local_e8._0_8_ = local_e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"i32","");
      local_c8 = local_c0 + 8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"i64","");
      local_c0._24_8_ = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x18),"f32","");
      plVar7 = local_78;
      local_88[0] = plVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"f64","");
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                 (string *)local_e8,&local_68);
      bVar1 = Match(this,Lpar);
      if (bVar1) {
        RVar2 = ErrorExpected(this,&local_108,(char *)0x0);
        bVar1 = RVar2.enum_ == Error;
      }
      else {
        bVar1 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_108);
      lVar6 = -0x80;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -4;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0);
      if (!bVar1) {
        RVar2 = Expect(this,Rpar);
        pVVar5 = &local_68;
        goto LAB_00140a85;
      }
    }
    pVVar5 = &local_68;
  }
  else {
    Var::Var((Var *)local_e8);
    RVar2 = ParseValueType(this,(Var *)local_e8);
    if (RVar2.enum_ != Error) {
      if ((VarType)local_c8 == Index) {
        TVar4.type_index_ = 0;
        TVar4.enum_ = local_c0._0_4_;
        if (TVar4 != (Type)0xffffffeb) {
          global->type = TVar4;
          pVVar5 = (Var *)local_e8;
LAB_00140a85:
          Var::~Var(pVVar5);
          if (RVar2.enum_ == Error) {
            return (Result)Error;
          }
          return (Result)Ok;
        }
LAB_00140ac3:
        __assert_fail("!EnumIsReferenceWithIndex(enum_)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/type.h"
                      ,0x40,"wabt::Type::Type(int32_t)");
      }
LAB_00140aa4:
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                    ,0x3b,"Index wabt::Var::index() const");
    }
    pVVar5 = (Var *)local_e8;
  }
  Var::~Var(pVVar5);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseGlobalType(Global* global) {
  WABT_TRACE(ParseGlobalType);
  if (MatchLpar(TokenType::Mut)) {
    global->mutable_ = true;
    Var type;
    CHECK_RESULT(ParseValueType(&type));
    global->type = Type(type.index());
    CHECK_RESULT(ErrorIfLpar({"i32", "i64", "f32", "f64"}));
    EXPECT(Rpar);
  } else {
    Var type;
    CHECK_RESULT(ParseValueType(&type));
    global->type = Type(type.index());
  }

  return Result::Ok;
}